

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_area.h
# Opt level: O0

void __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id,int *prediction)

{
  bool bVar1;
  Scalar_conflict1 SVar2;
  Scalar_conflict1 *pSVar3;
  undefined4 *in_RDX;
  uint in_ESI;
  long in_RDI;
  int64_t quotient_1;
  int64_t abs_sum_1;
  int64_t quotient;
  int32_t abs_sum;
  int64_t upper_bound;
  uint64_t *cross_data;
  uint64_t *normal_data;
  VectorD<long,_3> cross;
  VectorD<long,_3> delta_prev;
  VectorD<long,_3> delta_next;
  VectorD<long,_3> pos_prev;
  VectorD<long,_3> pos_next;
  CornerIndex c_prev;
  CornerIndex c_next;
  VectorD<long,_3> normal;
  VectorD<long,_3> pos_cent;
  VertexCornersIterator<draco::MeshAttributeCornerTable> cit;
  CornerTable *corner_table;
  CornerTable *in_stack_fffffffffffffe58;
  int i;
  CornerTable *in_stack_fffffffffffffe60;
  VertexCornersIterator<draco::MeshAttributeCornerTable> *in_stack_fffffffffffffe70;
  VectorD<long,_3> *in_stack_fffffffffffffe78;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_stack_fffffffffffffe80;
  VectorD<long,_3> *in_stack_fffffffffffffe88;
  VectorD<long,_3> *in_stack_fffffffffffffec0;
  VectorD<long,_3> *in_stack_fffffffffffffec8;
  ThisIndexType local_9c;
  uint local_98;
  ThisIndexType local_94;
  uint local_90;
  ThisIndexType local_8c;
  uint local_88;
  ThisIndexType local_84;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_80;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_7c [8];
  uint local_5c;
  uint local_3c;
  VertexCornersIterator<draco::MeshAttributeCornerTable> local_38;
  CornerTable *local_20;
  undefined4 *local_18;
  CornerIndex local_4;
  
  local_18 = in_RDX;
  local_4.value_ = in_ESI;
  local_20 = MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::corner_table
                       ((MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *)(in_RDI + 0x18)
                       );
  local_3c = local_4.value_;
  VertexCornersIterator<draco::MeshAttributeCornerTable>::VertexCornersIterator
            (&local_38,local_20,local_4);
  local_5c = local_4.value_;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ::GetPositionForCorner
            (in_stack_fffffffffffffe80,(CornerIndex)(uint)((ulong)in_stack_fffffffffffffe88 >> 0x20)
            );
  VectorD<long,_3>::VectorD((VectorD<long,_3> *)in_stack_fffffffffffffe60);
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(local_7c);
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_80);
  while (bVar1 = VertexCornersIterator<draco::MeshAttributeCornerTable>::End
                           ((VertexCornersIterator<draco::MeshAttributeCornerTable> *)0x1ea6d1),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    if (*(int *)(in_RDI + 0x38) == 0) {
      local_88 = local_4.value_;
      local_84.value_ =
           (uint)MeshAttributeCornerTable::Next
                           (in_stack_fffffffffffffe58,(uint)in_stack_fffffffffffffe60);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(local_7c,&local_84);
      local_90 = local_4.value_;
      local_8c.value_ =
           (uint)MeshAttributeCornerTable::Previous
                           (in_stack_fffffffffffffe58,(uint)in_stack_fffffffffffffe60);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_80,&local_8c);
    }
    else {
      in_stack_fffffffffffffe58 = local_20;
      local_98 = (uint)VertexCornersIterator<draco::MeshAttributeCornerTable>::Corner(&local_38);
      local_94.value_ =
           (uint)MeshAttributeCornerTable::Next
                           (in_stack_fffffffffffffe58,(uint)in_stack_fffffffffffffe60);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(local_7c,&local_94);
      in_stack_fffffffffffffe60 = local_20;
      VertexCornersIterator<draco::MeshAttributeCornerTable>::Corner(&local_38);
      local_9c.value_ =
           (uint)MeshAttributeCornerTable::Previous
                           (in_stack_fffffffffffffe58,(uint)in_stack_fffffffffffffe60);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_80,&local_9c);
    }
    MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ::GetPositionForCorner
              (in_stack_fffffffffffffe80,
               (CornerIndex)(uint)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ::GetPositionForCorner
              (in_stack_fffffffffffffe80,
               (CornerIndex)(uint)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    VectorD<long,_3>::operator-(in_stack_fffffffffffffe88,(Self *)in_stack_fffffffffffffe80);
    VectorD<long,_3>::operator-(in_stack_fffffffffffffe88,(Self *)in_stack_fffffffffffffe80);
    CrossProduct<long>(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    pSVar3 = VectorD<long,_3>::data((VectorD<long,_3> *)0x1ea8b8);
    in_stack_fffffffffffffec8 =
         (VectorD<long,_3> *)VectorD<long,_3>::data((VectorD<long,_3> *)0x1ea8ca);
    *pSVar3 = *pSVar3 + (in_stack_fffffffffffffec8->v_)._M_elems[0];
    pSVar3[1] = pSVar3[1] + (in_stack_fffffffffffffec8->v_)._M_elems[1];
    pSVar3[2] = pSVar3[2] + (in_stack_fffffffffffffec8->v_)._M_elems[2];
    VertexCornersIterator<draco::MeshAttributeCornerTable>::Next(in_stack_fffffffffffffe70);
  }
  if (*(int *)(in_RDI + 0x38) == 0) {
    SVar2 = VectorD<long,_3>::AbsSum(in_stack_fffffffffffffe78);
    i = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    if (0x20000000 < (int)SVar2) {
      VectorD<long,_3>::operator/
                (in_stack_fffffffffffffe88,(Scalar_conflict1 *)in_stack_fffffffffffffe80);
    }
  }
  else {
    SVar2 = VectorD<long,_3>::AbsSum(in_stack_fffffffffffffe78);
    i = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    if (0x20000000 < SVar2) {
      VectorD<long,_3>::operator/
                ((VectorD<long,_3> *)(SVar2 / 0x20000000),
                 (Scalar_conflict1 *)in_stack_fffffffffffffe80);
    }
  }
  pSVar3 = VectorD<long,_3>::operator[]((VectorD<long,_3> *)in_stack_fffffffffffffe60,i);
  *local_18 = (int)*pSVar3;
  pSVar3 = VectorD<long,_3>::operator[]((VectorD<long,_3> *)in_stack_fffffffffffffe60,i);
  local_18[1] = (int)*pSVar3;
  pSVar3 = VectorD<long,_3>::operator[]((VectorD<long,_3> *)in_stack_fffffffffffffe60,i);
  local_18[2] = (int)*pSVar3;
  return;
}

Assistant:

void ComputePredictedValue(CornerIndex corner_id,
                             DataTypeT *prediction) override {
    DRACO_DCHECK(this->IsInitialized());
    typedef typename MeshDataT::CornerTable CornerTable;
    const CornerTable *const corner_table = this->mesh_data_.corner_table();
    // Going to compute the predicted normal from the surrounding triangles
    // according to the connectivity of the given corner table.
    VertexCornersIterator<CornerTable> cit(corner_table, corner_id);
    // Position of central vertex does not change in loop.
    const VectorD<int64_t, 3> pos_cent = this->GetPositionForCorner(corner_id);
    // Computing normals for triangles and adding them up.

    VectorD<int64_t, 3> normal;
    CornerIndex c_next, c_prev;
    while (!cit.End()) {
      // Getting corners.
      if (this->normal_prediction_mode_ == ONE_TRIANGLE) {
        c_next = corner_table->Next(corner_id);
        c_prev = corner_table->Previous(corner_id);
      } else {
        c_next = corner_table->Next(cit.Corner());
        c_prev = corner_table->Previous(cit.Corner());
      }
      const VectorD<int64_t, 3> pos_next = this->GetPositionForCorner(c_next);
      const VectorD<int64_t, 3> pos_prev = this->GetPositionForCorner(c_prev);

      // Computing delta vectors to next and prev.
      const VectorD<int64_t, 3> delta_next = pos_next - pos_cent;
      const VectorD<int64_t, 3> delta_prev = pos_prev - pos_cent;

      // Computing cross product.
      const VectorD<int64_t, 3> cross = CrossProduct(delta_next, delta_prev);

      // Prevent signed integer overflows by doing math as unsigned.
      auto normal_data = reinterpret_cast<uint64_t *>(normal.data());
      auto cross_data = reinterpret_cast<const uint64_t *>(cross.data());
      normal_data[0] = normal_data[0] + cross_data[0];
      normal_data[1] = normal_data[1] + cross_data[1];
      normal_data[2] = normal_data[2] + cross_data[2];

      cit.Next();
    }

    // Convert to int32_t, make sure entries are not too large.
    constexpr int64_t upper_bound = 1 << 29;
    if (this->normal_prediction_mode_ == ONE_TRIANGLE) {
      const int32_t abs_sum = static_cast<int32_t>(normal.AbsSum());
      if (abs_sum > upper_bound) {
        const int64_t quotient = abs_sum / upper_bound;
        normal = normal / quotient;
      }
    } else {
      const int64_t abs_sum = normal.AbsSum();
      if (abs_sum > upper_bound) {
        const int64_t quotient = abs_sum / upper_bound;
        normal = normal / quotient;
      }
    }
    DRACO_DCHECK_LE(normal.AbsSum(), upper_bound);
    prediction[0] = static_cast<int32_t>(normal[0]);
    prediction[1] = static_cast<int32_t>(normal[1]);
    prediction[2] = static_cast<int32_t>(normal[2]);
  }